

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_exeWatcher.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  int iVar2;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  undefined8 uStack_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  string file_name;
  exeWatcher ew;
  
  file_name._M_dataplus._M_p = (pointer)&file_name.field_2;
  file_name._M_string_length = 0;
  file_name.field_2._M_local_buf[0] = '\0';
  if (argc == 2) {
    std::__cxx11::string::assign((char *)&file_name);
    std::__cxx11::string::string((string *)&local_b8,(string *)&file_name);
    local_88 = (code *)0x0;
    pcStack_80 = (code *)0x0;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_98._M_unused._M_object = operator_new(0x20);
    uVar1 = local_b0;
    *(code **)local_98._M_unused._0_8_ = (code *)((long)local_98._M_unused._0_8_ + 0x10);
    if (local_b8 == &local_a8) {
      *(ulong *)((long)local_98._M_unused._0_8_ + 0x10) = CONCAT71(uStack_a7,local_a8);
      *(undefined8 *)((long)local_98._M_unused._0_8_ + 0x18) = uStack_a0;
    }
    else {
      *(undefined1 **)local_98._M_unused._0_8_ = local_b8;
      *(ulong *)((long)local_98._M_unused._0_8_ + 0x10) = CONCAT71(uStack_a7,local_a8);
    }
    local_b0 = 0;
    *(undefined8 *)((long)local_98._M_unused._0_8_ + 8) = uVar1;
    local_a8 = 0;
    pcStack_80 = std::
                 _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/test/example_exeWatcher.cpp:11:48)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/test/example_exeWatcher.cpp:11:48)>
               ::_M_manager;
    local_b8 = &local_a8;
    wmj::fileWatcher::exeWatcher::exeWatcher(&ew,&file_name,(function<void_(bool)> *)&local_98);
    std::_Function_base::~_Function_base((_Function_base *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    wmj::fileWatcher::exeWatcher::startWatch(&ew);
    wmj::fileWatcher::exeWatcher::run(&ew);
    wmj::fileWatcher::exeWatcher::~exeWatcher(&ew);
    iVar2 = 0;
  }
  else {
    iVar2 = 1;
  }
  std::__cxx11::string::~string((string *)&file_name);
  return iVar2;
}

Assistant:

int main(int argc, char **argv) {
    std::string file_name;
    if(argc == 2) {
        file_name = argv[1];
    } else {
        return 1;
    }
    wmj::fileWatcher::exeWatcher ew(file_name, [file_name](bool if_open) {
        if(if_open) {
            std::cout << file_name << " launched" << std::endl;
        } else {
            std::cout << file_name << " close" << std::endl;
        }
    });
    ew.startWatch();
    ew.run();
    return 0;
}